

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O3

void __thiscall AMusicChanger::PostBeginPlay(AMusicChanger *this)

{
  AActor *triggerer;
  undefined8 *puVar1;
  int i;
  long lVar2;
  
  AActor::PostBeginPlay((AActor *)this);
  puVar1 = &players;
  lVar2 = 0;
  do {
    if (((playeringame[lVar2] == true) &&
        (triggerer = (AActor *)*puVar1, triggerer != (AActor *)0x0)) &&
       (triggerer->Sector == (this->super_ASectorAction).super_AActor.Sector)) {
      ASectorAction::TriggerAction(&this->super_ASectorAction,triggerer,1);
    }
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + 0x54;
  } while (lVar2 != 8);
  return;
}

Assistant:

void AMusicChanger::PostBeginPlay()
{
	// The music changer should consider itself activated if the player
	// spawns in its sector as well as if it enters the sector during a P_TryMove.
	Super::PostBeginPlay();
	for (int i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i] && players[i].mo && players[i].mo->Sector == this->Sector)
		{
			TriggerAction(players[i].mo, SECSPAC_Enter);
		}
	}
}